

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O3

loc monster_target_loc(monster_conflict *mon)

{
  wchar_t idx;
  _Bool _Var1;
  monster *pmVar2;
  loc lVar3;
  loc_conflict grid2;
  
  idx = (mon->target).midx;
  if (idx == L'\xffffffff') {
    _Var1 = monster_is_decoyed((monster *)mon);
    if (_Var1) {
      lVar3 = cave_find_decoy(cave);
      return lVar3;
    }
    lVar3.x = (player->grid).x;
    lVar3.y = (player->grid).y;
  }
  else if (idx < L'\x01') {
    grid2 = loc(0,0);
    _Var1 = loc_eq((mon->target).grid,grid2);
    if (_Var1) {
      lVar3 = mon->grid;
    }
    else {
      lVar3.x = (mon->target).grid.x;
      lVar3.y = (mon->target).grid.y;
    }
  }
  else {
    pmVar2 = cave_monster(cave,idx);
    lVar3.x = (pmVar2->grid).x;
    lVar3.y = (pmVar2->grid).y;
  }
  return lVar3;
}

Assistant:

struct loc monster_target_loc(const struct monster *mon)
{
	if (mon->target.midx == -1) {
		/* Player (or decoy) */
		return monster_is_decoyed(mon) ? cave_find_decoy(cave) : player->grid;
	} else if (mon->target.midx > 0) {
		/* Monster */
		return cave_monster(cave, mon->target.midx)->grid;
	} else if (!loc_eq(mon->target.grid, loc(0, 0))) {
		return mon->target.grid;
	}
	/* Probably an error */
	return mon->grid;
}